

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void __thiscall sf::priv::GlxContext::~GlxContext(GlxContext *this)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  GlContext *in_RDI;
  Display *unaff_retaddr;
  
  in_RDI->_vptr_GlContext = (_func_int **)&PTR__GlxContext_001d7c38;
  GlContext::cleanupUnsharedResources(&this->super_GlContext);
  lVar7._0_4_ = in_RDI[1].m_settings.antialiasingLevel;
  lVar7._4_4_ = in_RDI[1].m_settings.majorVersion;
  if (lVar7 != 0) {
    lVar7 = glXGetCurrentContext();
    lVar1._0_4_ = in_RDI[1].m_settings.antialiasingLevel;
    lVar1._4_4_ = in_RDI[1].m_settings.majorVersion;
    if (lVar7 == lVar1) {
      glXMakeCurrent(in_RDI[1]._vptr_GlContext,0);
    }
    uVar2._0_4_ = in_RDI[1].m_settings.antialiasingLevel;
    uVar2._4_4_ = in_RDI[1].m_settings.majorVersion;
    glXDestroyContext(in_RDI[1]._vptr_GlContext,uVar2);
  }
  lVar3._0_4_ = in_RDI[1].m_settings.minorVersion;
  lVar3._4_4_ = in_RDI[1].m_settings.attributeFlags;
  if (lVar3 != 0) {
    uVar4._0_4_ = in_RDI[1].m_settings.minorVersion;
    uVar4._4_4_ = in_RDI[1].m_settings.attributeFlags;
    glXDestroyPbuffer(in_RDI[1]._vptr_GlContext,uVar4);
  }
  lVar5._0_4_ = in_RDI[1].m_settings.depthBits;
  lVar5._4_4_ = in_RDI[1].m_settings.stencilBits;
  if ((lVar5 != 0) && ((in_RDI[1].m_settings.sRgbCapable & 1U) != 0)) {
    uVar6._0_4_ = in_RDI[1].m_settings.depthBits;
    uVar6._4_4_ = in_RDI[1].m_settings.stencilBits;
    XDestroyWindow(in_RDI[1]._vptr_GlContext,uVar6);
    XFlush(in_RDI[1]._vptr_GlContext);
  }
  CloseDisplay(unaff_retaddr);
  GlContext::~GlContext(in_RDI);
  return;
}

Assistant:

GlxContext::~GlxContext()
{
    // Notify unshared OpenGL resources of context destruction
    cleanupUnsharedResources();

    // Destroy the context
    if (m_context)
    {
#if defined(GLX_DEBUGGING)
        GlxErrorHandler handler(m_display);
#endif

        if (glXGetCurrentContext() == m_context)
            glXMakeCurrent(m_display, None, NULL);
        glXDestroyContext(m_display, m_context);

#if defined(GLX_DEBUGGING)
        if (glxErrorOccurred)
            err() << "GLX error in GlxContext::~GlxContext()" << std::endl;
#endif
    }

    if (m_pbuffer)
    {
        glXDestroyPbuffer(m_display, m_pbuffer);
    }

    // Destroy the window if we own it
    if (m_window && m_ownsWindow)
    {
        XDestroyWindow(m_display, m_window);
        XFlush(m_display);
    }

    // Close the connection with the X server
    CloseDisplay(m_display);
}